

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O1

Gia_MmFixed_t * Gia_MmFixedStart(int nEntrySize,int nEntriesMax)

{
  int iVar1;
  Gia_MmFixed_t *pGVar2;
  char **ppcVar3;
  int iVar4;
  
  pGVar2 = (Gia_MmFixed_t *)malloc(0x38);
  pGVar2->nEntrySize = 0;
  pGVar2->nEntriesAlloc = 0;
  pGVar2->nEntriesUsed = 0;
  pGVar2->nEntriesMax = 0;
  pGVar2->pEntriesFree = (char *)0x0;
  pGVar2->nChunkSize = 0;
  pGVar2->nChunksAlloc = 0;
  *(undefined8 *)&pGVar2->nChunks = 0;
  pGVar2->pChunks = (char **)0x0;
  pGVar2->nMemoryUsed = 0;
  pGVar2->nMemoryAlloc = 0;
  pGVar2->nEntrySize = nEntrySize;
  pGVar2->nEntriesAlloc = 0;
  pGVar2->nEntriesUsed = 0;
  iVar1 = nEntriesMax + 7;
  if (-1 < nEntriesMax) {
    iVar1 = nEntriesMax;
  }
  iVar4 = 8;
  if (0x3f < nEntriesMax) {
    iVar4 = iVar1 >> 3;
  }
  pGVar2->pEntriesFree = (char *)0x0;
  pGVar2->nChunkSize = iVar4;
  pGVar2->nChunksAlloc = 0x40;
  pGVar2->nChunks = 0;
  ppcVar3 = (char **)malloc(0x200);
  pGVar2->pChunks = ppcVar3;
  pGVar2->nMemoryUsed = 0;
  pGVar2->nMemoryAlloc = 0;
  return pGVar2;
}

Assistant:

Gia_MmFixed_t * Gia_MmFixedStart( int nEntrySize, int nEntriesMax )
{
    Gia_MmFixed_t * p;

    p = ABC_ALLOC( Gia_MmFixed_t, 1 );
    memset( p, 0, sizeof(Gia_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    p->nChunkSize = nEntriesMax / 8;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}